

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type.cc
# Opt level: O1

void __thiscall iqxmlrpc::Date_time::Date_time(Date_time *this,bool use_lt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  time_duration_type tVar3;
  undefined7 in_register_00000031;
  ptime p;
  tm timetm;
  time_rep_type local_60;
  date<boost::gregorian::date,_boost::gregorian::gregorian_calendar,_boost::gregorian::date_duration>
  local_54;
  tm local_50;
  
  (this->super_Value_type)._vptr_Value_type = (_func_int **)&PTR__Date_time_0018c070;
  (this->cache)._M_dataplus._M_p = (pointer)&(this->cache).field_2;
  (this->cache)._M_string_length = 0;
  (this->cache).field_2._M_local_buf[0] = '\0';
  if ((int)CONCAT71(in_register_00000031,use_lt) == 0) {
    local_60.time_count_.value_ =
         (impl_type)boost::date_time::second_clock<boost::posix_time::ptime>::universal_time();
  }
  else {
    local_60.time_count_.value_ =
         (impl_type)boost::date_time::second_clock<boost::posix_time::ptime>::local_time();
  }
  local_54.days_ =
       (date_int_type)
       boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>::
       date(&local_60);
  boost::gregorian::to_tm(&local_50,(date *)&local_54);
  tVar3 = boost::date_time::
          counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>
          ::get_time_of_day(&local_60);
  auVar1 = SEXT816((long)tVar3.
                         super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                         .ticks_.value_ / 60000000) * ZEXT816(0x8888888888888889);
  auVar2 = SEXT816((long)tVar3.
                         super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                         .ticks_.value_ / 1000000) * ZEXT816(0x8888888888888889);
  (this->tm_).tm_mon = local_50.tm_mon;
  (this->tm_).tm_year = local_50.tm_year;
  (this->tm_).tm_wday = local_50.tm_wday;
  (this->tm_).tm_yday = local_50.tm_yday;
  (this->tm_).tm_zone = local_50.tm_zone;
  (this->tm_).tm_isdst = -1;
  *(undefined8 *)&(this->tm_).field_0x24 = local_50._36_8_;
  *(undefined4 *)((long)&(this->tm_).tm_gmtoff + 4) = local_50.tm_gmtoff._4_4_;
  (this->tm_).tm_sec =
       (int)((long)tVar3.
                   super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                   .ticks_.value_ / 1000000) +
       ((int)(auVar2._8_8_ >> 5) - (auVar2._12_4_ >> 0x1f)) * -0x3c;
  (this->tm_).tm_min =
       (int)((long)tVar3.
                   super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                   .ticks_.value_ / 60000000) +
       ((int)(auVar1._8_8_ >> 5) - (auVar1._12_4_ >> 0x1f)) * -0x3c;
  (this->tm_).tm_hour =
       (int)(SUB168(SEXT816((long)tVar3.
                                  super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                                  .ticks_.value_) * ZEXT816(0x98b5bf2c03e529c5),8) >> 0x1f) -
       (SUB164(SEXT816((long)tVar3.
                             super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                             .ticks_.value_) * ZEXT816(0x98b5bf2c03e529c5),0xc) >> 0x1f);
  (this->tm_).tm_mday = local_50.tm_mday;
  return;
}

Assistant:

Date_time::Date_time( bool use_lt )
{
  using namespace boost::posix_time;
  ptime p = use_lt ? second_clock::local_time() : second_clock::universal_time();
  tm_ = to_tm(p);
}